

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

TestNode *
deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,ClearType clearType)

{
  FramebufferClearCase *this;
  ClearType clearType_local;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  
  this = (FramebufferClearCase *)operator_new(0x80);
  anon_unknown_0::FramebufferClearCase::FramebufferClearCase
            (this,testCtx,renderCtx,name,desc,clearType);
  return (TestNode *)this;
}

Assistant:

tcu::TestNode* createFramebufferClearTest (tcu::TestContext&	testCtx,
										   glu::RenderContext&	renderCtx,
										   const char*			name,
										   const char*			desc,
										   ClearType			clearType)
{
	return new FramebufferClearCase(testCtx, renderCtx, name, desc, clearType);
}